

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_decoder.c
# Opt level: O0

lzma_ret lzma_raw_decoder(lzma_stream *strm,lzma_filter *options)

{
  lzma_ret ret__1;
  lzma_ret ret_;
  lzma_filter *options_local;
  lzma_stream *strm_local;
  
  strm_local._4_4_ = lzma_strm_init(strm);
  if (strm_local._4_4_ == LZMA_OK) {
    strm_local._4_4_ =
         lzma_raw_decoder_init((lzma_next_coder *)strm->internal,strm->allocator,options);
    if (strm_local._4_4_ == LZMA_OK) {
      strm->internal->supported_actions[0] = true;
      strm->internal->supported_actions[3] = true;
      strm_local._4_4_ = LZMA_OK;
    }
    else {
      lzma_end(strm);
    }
  }
  return strm_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_raw_decoder(lzma_stream *strm, const lzma_filter *options)
{
	lzma_next_strm_init1(lzma_raw_decoder_init, strm, options);

	strm->internal->supported_actions[LZMA_RUN] = true;
	strm->internal->supported_actions[LZMA_FINISH] = true;

	return LZMA_OK;
}